

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBOCache.cpp
# Opt level: O2

GLFrameBufferObj * __thiscall
Diligent::FBOCache::GetFBO(FBOCache *this,Uint32 Width,Uint32 Height,GLContextState *ContextState)

{
  _Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
  _Var1;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false,_false>,_bool>
  pVar2;
  GLFrameBufferObj NewFBO;
  string msg;
  FBOCacheKey Key;
  GLFrameBufferObj local_20c;
  string local_1f8;
  FBOCacheKey local_1d8;
  
  FBOCacheKey::FBOCacheKey(&local_1d8);
  local_1d8.Width = Width;
  local_1d8.Height = Height;
  Threading::SpinLock::lock(&this->m_CacheLock);
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<Diligent::FBOCache::FBOCacheKey,_std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_std::allocator<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FBOCache::FBOCacheKey>,_Diligent::FBOCache::FBOCacheKeyHashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->m_Cache)._M_h,&local_1d8);
  if (_Var1._M_cur == (__node_type *)0x0) {
    CreateFBO(&local_20c,ContextState,0,(TextureViewGLImpl **)0x0,(TextureViewGLImpl *)0x0,Width,
              Height);
    pVar2 = std::
            _Hashtable<Diligent::FBOCache::FBOCacheKey,std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>,std::allocator<std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>>,std::__detail::_Select1st,std::equal_to<Diligent::FBOCache::FBOCacheKey>,Diligent::FBOCache::FBOCacheKeyHashFunc,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<Diligent::FBOCache::FBOCacheKey&,GLObjectWrappers::GLFrameBufferObj>
                      ((_Hashtable<Diligent::FBOCache::FBOCacheKey,std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>,std::allocator<std::pair<Diligent::FBOCache::FBOCacheKey_const,GLObjectWrappers::GLFrameBufferObj>>,std::__detail::_Select1st,std::equal_to<Diligent::FBOCache::FBOCacheKey>,Diligent::FBOCache::FBOCacheKeyHashFunc,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->m_Cache,&local_1d8,&local_20c);
    _Var1._M_cur = (__node_type *)
                   pVar2.first.
                   super__Node_iterator_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
                   ._M_cur;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[25]>(&local_1f8,(char (*) [25])"New FBO was not inserted");
      DebugAssertionFailed
                (local_1f8._M_dataplus._M_p,"GetFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/FBOCache.cpp"
                 ,0x13a);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
              (&local_20c.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
  }
  Threading::SpinLock::unlock(&this->m_CacheLock);
  return (GLFrameBufferObj *)
         ((long)&((_Var1._M_cur)->
                 super__Hash_node_value<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<const_Diligent::FBOCache::FBOCacheKey,_GLObjectWrappers::GLFrameBufferObj>_>
                 ._M_storage._M_storage + 0x1a8);
}

Assistant:

const GLObjectWrappers::GLFrameBufferObj& FBOCache::GetFBO(Uint32 Width, Uint32 Height, GLContextState& ContextState)
{
    FBOCacheKey Key;
    Key.Width  = Width;
    Key.Height = Height;

    // Lock the cache
    Threading::SpinLockGuard CacheGuard{m_CacheLock};

    // Try to find FBO in the map
    auto fbo_it = m_Cache.find(Key);
    if (fbo_it == m_Cache.end())
    {
        // Create a new FBO
        GLObjectWrappers::GLFrameBufferObj NewFBO = CreateFBO(ContextState, 0, nullptr, nullptr, Width, Height);

        auto it_inserted = m_Cache.emplace(Key, std::move(NewFBO));
        // New FBO must be actually inserted
        VERIFY(it_inserted.second, "New FBO was not inserted");
        fbo_it = it_inserted.first;
    }
    return fbo_it->second;
}